

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzrot::VariablesQbSetSpeed(ChNodeFEAxyzrot *this,double step)

{
  undefined1 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  double dVar5;
  ChVectorRef local_c8;
  ChVector<double> local_b0;
  ChVector<double> v;
  
  auVar3 = *(undefined1 (*) [16])&this->field_0xa0;
  dVar2 = *(double *)&this->field_0xb0;
  puVar1 = &(this->super_ChNodeFEAbase).field_0x18;
  auVar4 = *(undefined1 (*) [32])&this->field_0xb8;
  ChVariables::Get_qb(&local_c8,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)&v,&local_c8,0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&local_b0,
             (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
              *)&v,(type *)0x0);
  (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x38))(puVar1,&local_b0);
  ChVariables::Get_qb(&local_c8,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)&v,&local_c8,3,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&local_b0,
             (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
              *)&v,(type *)0x0);
  (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x48))(puVar1,&local_b0);
  if ((step != 0.0) || (NAN(step))) {
    dVar5 = 1.0 / step;
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])&this->field_0xa0,auVar3);
    v.m_data[2] = dVar5 * (*(double *)&this->field_0xb0 - dVar2);
    v.m_data[0] = dVar5 * auVar3._0_8_;
    v.m_data[1] = dVar5 * auVar3._8_8_;
    (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x60))(puVar1,&v);
    auVar4 = vsubpd_avx(*(undefined1 (*) [32])&this->field_0xb8,auVar4);
    v.m_data[0] = auVar4._0_8_ * dVar5;
    v.m_data[1] = auVar4._8_8_ * dVar5;
    v.m_data[2] = auVar4._16_8_ * dVar5;
    (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x68))(puVar1,&v);
  }
  return;
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbSetSpeed(double step) {
    ChCoordsys<> old_coord_dt = this->GetCoord_dt();

    // from 'qb' vector, sets body speed, and updates auxiliary data
    this->SetPos_dt(this->variables.Get_qb().segment(0, 3));
    this->SetWvel_loc(this->variables.Get_qb().segment(3, 3));

    // apply limits (if in speed clamping mode) to speeds.
    // ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        this->SetPos_dtdt((this->GetCoord_dt().pos - old_coord_dt.pos) / step);
        this->SetRot_dtdt((this->GetCoord_dt().rot - old_coord_dt.rot) / step);
    }
}